

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeString.cpp
# Opt level: O0

EStatusCode __thiscall
UnicodeString::FromUTF16UShort(UnicodeString *this,unsigned_short *inShorts,unsigned_long inLength)

{
  ulong uVar1;
  Trace *pTVar2;
  ulong local_40;
  value_type_conflict local_38;
  ulong local_30;
  unsigned_long i;
  unsigned_long uStack_20;
  EStatusCode status;
  unsigned_long inLength_local;
  unsigned_short *inShorts_local;
  UnicodeString *this_local;
  
  uStack_20 = inLength;
  inLength_local = (unsigned_long)inShorts;
  inShorts_local = (unsigned_short *)this;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->mUnicodeCharacters);
  i._4_4_ = eSuccess;
  local_30 = 0;
  do {
    if (uStack_20 <= local_30 || i._4_4_ != eSuccess) {
      return i._4_4_;
    }
    if ((*(ushort *)(inLength_local + local_30 * 2) < 0xd800) ||
       (0xdbff < *(ushort *)(inLength_local + local_30 * 2))) {
      local_40 = (ulong)*(ushort *)(inLength_local + local_30 * 2);
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->mUnicodeCharacters,&local_40);
    }
    else {
      uVar1 = local_30 + 1;
      if (uStack_20 <= uVar1) {
        local_30 = uVar1;
        pTVar2 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar2,
                          "UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate"
                         );
        return eFailure;
      }
      if ((*(ushort *)(inLength_local + uVar1 * 2) < 0xdc00) ||
         (0xdfff < *(ushort *)(inLength_local + uVar1 * 2))) {
        local_30 = uVar1;
        pTVar2 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar2,
                          "UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate"
                         );
        return eFailure;
      }
      local_38 = (value_type_conflict)
                 (int)((*(ushort *)(inLength_local + local_30 * 2) - 0xd800) * 0x400 +
                      *(ushort *)(inLength_local + uVar1 * 2) + 0x2400);
      local_30 = uVar1;
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->mUnicodeCharacters,&local_38);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

EStatusCode UnicodeString::FromUTF16UShort(const unsigned short* inShorts, unsigned long inLength)
{
	mUnicodeCharacters.clear();
	EStatusCode status = PDFHummus::eSuccess;

	for(unsigned long i = 0; i < inLength && PDFHummus::eSuccess == status; ++i)
	{
		if(0xD800 <= inShorts[i] && inShorts[i] <= 0xDBFF) 
		{
			// Aha! high surrogate! this means that this character requires 2 w_chars
			++i;
			if(i>=inLength)
			{
				TRACE_LOG("UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			if(0xDC00 > inShorts[i] || inShorts[i] > 0xDFFF)
			{
				TRACE_LOG("UnicodeString::FromUTF16UShort, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			mUnicodeCharacters.push_back(0x10000 + ((inShorts[i-1] - 0xD800) << 10) + (inShorts[i] - 0xDC00));
		}
		else
			mUnicodeCharacters.push_back(inShorts[i]);		
	}

	return status;		
}